

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_PluginNoEditionsSupport_Test::
~CommandLineInterfaceTest_PluginNoEditionsSupport_Test
          (CommandLineInterfaceTest_PluginNoEditionsSupport_Test *this)

{
  CommandLineInterfaceTest_PluginNoEditionsSupport_Test *this_local;
  
  ~CommandLineInterfaceTest_PluginNoEditionsSupport_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, PluginNoEditionsSupport) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    message Foo {
      int32 i = 1;
    }
  )schema");

  SetMockGeneratorTestCase("no_editions");
  Run("protocol_compiler "
      "--proto_path=$tmpdir foo.proto --plug_out=$tmpdir");

  ExpectErrorSubstring(
      "code generator prefix-gen-plug hasn't been updated to support editions");
}